

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::UtilsTest_HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding_Test::
~UtilsTest_HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding_Test
          (UtilsTest_HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UtilsTest, HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding)
{
    ByteArray   buf;
    std::string hexStr;

    hexStr = utils::Hex(ByteArray{0x00, 0x01, 0x02, 0x03});

    EXPECT_EQ(hexStr, "00010203");
    EXPECT_EQ(utils::Hex(buf, hexStr), ErrorCode::kNone);
    EXPECT_EQ(buf, (ByteArray{0x00, 0x01, 0x02, 0x03}));
}